

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSet.cpp
# Opt level: O2

bool __thiscall xercesc_4_0::BitSet::equals(BitSet *this,BitSet *other)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  XMLSize_t XVar3;
  bool bVar4;
  
  if (this == other) {
    return true;
  }
  if (this->fUnitLen == other->fUnitLen) {
    XVar3 = 0;
    do {
      bVar4 = this->fUnitLen == XVar3;
      if (bVar4) {
        return bVar4;
      }
      puVar1 = this->fBits + XVar3;
      puVar2 = other->fBits + XVar3;
      XVar3 = XVar3 + 1;
    } while (*puVar1 == *puVar2);
    return bVar4;
  }
  return false;
}

Assistant:

bool BitSet::equals(const BitSet& other) const
{
    if (this == &other)
        return true;

    if (fUnitLen != other.fUnitLen)
        return false;

    for (XMLSize_t i = 0; i < fUnitLen; i++)
    {
        if (fBits[i] != other.fBits[i])
            return false;
    }
    return true;
}